

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O1

QString * __thiscall QVersionNumber::toString(QString *__return_storage_ptr__,QVersionNumber *this)

{
  ArrayOptions *pAVar1;
  byte bVar2;
  Data *pDVar3;
  bool bVar4;
  long lVar5;
  int n;
  long alloc;
  long lVar6;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  bVar2 = (this->m_segments).field_0.inline_segments[0];
  if ((bVar2 & 1) == 0) {
    lVar6 = (((this->m_segments).field_0.pointer_segments)->d).size;
  }
  else {
    lVar6 = (long)((char)bVar2 >> 1);
  }
  lVar5 = 1;
  if (1 < lVar6 * 2) {
    lVar5 = lVar6 * 2;
  }
  pDVar3 = (__return_storage_ptr__->d).d;
  if (((pDVar3 == (Data *)0x0) ||
      (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar3->super_QArrayData).alloc -
      ((long)((long)(__return_storage_ptr__->d).ptr -
             ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1) <
      lVar5)) {
    lVar6 = (__return_storage_ptr__->d).size;
    alloc = lVar5 + -1;
    if (lVar5 + -1 < lVar6) {
      alloc = lVar6;
    }
    QString::reallocData(__return_storage_ptr__,alloc,KeepSize);
  }
  pDVar3 = (__return_storage_ptr__->d).d;
  if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar3->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  bVar4 = true;
  lVar6 = 0;
  while( true ) {
    bVar2 = (this->m_segments).field_0.inline_segments[0];
    if ((bVar2 & 1) == 0) {
      lVar5 = (((this->m_segments).field_0.pointer_segments)->d).size;
    }
    else {
      lVar5 = (long)((char)bVar2 >> 1);
    }
    if (lVar5 <= lVar6) break;
    if (!bVar4) {
      QString::append(__return_storage_ptr__,(QChar)0x2e);
    }
    bVar2 = (this->m_segments).field_0.inline_segments[0];
    if ((bVar2 & 1) == 0) {
      lVar5 = (((this->m_segments).field_0.pointer_segments)->d).size;
    }
    else {
      lVar5 = (long)((char)bVar2 >> 1);
    }
    n = 0;
    if (lVar6 < lVar5) {
      if ((bVar2 & 1) == 0) {
        n = (((this->m_segments).field_0.pointer_segments)->d).ptr[lVar6];
      }
      else {
        n = (int)(this->m_segments).field_0.inline_segments[lVar6 + 1];
      }
    }
    QString::number(&local_40,n,10);
    QString::append(__return_storage_ptr__,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    lVar6 = lVar6 + 1;
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QVersionNumber::toString() const
{
    QString version;
    version.reserve(qMax(segmentCount() * 2 - 1, 0));
    bool first = true;
    for (qsizetype i = 0; i < segmentCount(); ++i) {
        if (!first)
            version += u'.';
        version += QString::number(segmentAt(i));
        first = false;
    }
    return version;
}